

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O2

void testInputPart(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing reading multipart tiles and scanlines with InputPart");
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_142edc::testWriteRead(1,1,5,tempDir);
  anon_unknown.dwarf_142edc::testWriteRead(2,2,1,tempDir);
  anon_unknown.dwarf_142edc::testWriteRead(8,4,2,tempDir);
  anon_unknown.dwarf_142edc::testWriteRead(0x32,3,0xb,tempDir);
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void testInputPart (const std::string & tempDir)
{
    try
    {
        cout << "Testing reading multipart tiles and scanlines with InputPart" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        testWriteRead ( 1, 1,  5, tempDir);
        testWriteRead ( 2, 2,  1, tempDir);
        testWriteRead ( 8, 4,  2, tempDir);
        testWriteRead (50, 3, 11, tempDir);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}